

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QString * qt_accStripAmp(QString *__return_storage_ptr__,QString *text)

{
  Data *pDVar1;
  long lVar2;
  long from;
  long *plVar3;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QArrayData *local_40;
  char16_t *local_38;
  long local_30;
  QStringView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &((text->d).d)->super_QArrayData;
  local_38 = (text->d).ptr;
  local_30 = (text->d).size;
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_40->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_40->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((local_30 != 0) &&
     (local_28.m_size = local_30, local_28.m_data = local_38,
     lVar2 = QStringView::indexOf(&local_28,(QChar)0x26,0,CaseSensitive), lVar2 != -1)) {
    do {
      from = lVar2 + 1;
      if (from < local_30) {
        if (local_38[lVar2 + 1] != L'&') {
          if (lVar2 != -1) {
            QString::remove((longlong)&local_40,lVar2);
          }
          break;
        }
        from = lVar2 + 2;
      }
      local_28.m_size = local_30;
      local_28.m_data = local_38;
      lVar2 = QStringView::indexOf(&local_28,(QChar)0x26,from,CaseSensitive);
    } while (lVar2 != -1);
  }
  QVar4.m_data = (char *)0x2;
  QVar4.m_size = (qsizetype)&local_40;
  QVar5.m_data = (char *)0x1;
  QVar5.m_size = (qsizetype)"&&";
  plVar3 = (long *)QString::replace(QVar4,QVar5,0x6d3975);
  pDVar1 = (Data *)*plVar3;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (char16_t *)plVar3[1];
  (__return_storage_ptr__->d).size = plVar3[2];
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString qt_accStripAmp(const QString &text)
{
    QString newText(text);
    qsizetype ampIndex = qt_accAmpIndex(newText);
    if (ampIndex != -1)
        newText.remove(ampIndex, 1);

    return newText.replace("&&"_L1, "&"_L1);
}